

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_traceinfo(lua_State *L)

{
  TValue *pTVar1;
  GCtrace *name;
  lua_State *L_00;
  lua_State *in_RDI;
  bool bVar2;
  GCtab *t;
  GCtrace *T;
  lua_State *in_stack_ffffffffffffff98;
  int32_t val;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  lua_State *in_stack_ffffffffffffffc8;
  
  name = jit_checktrace(in_stack_ffffffffffffff98);
  bVar2 = name != (GCtrace *)0x0;
  if (bVar2) {
    lua_createtable(in_RDI,(int)((ulong)name >> 0x20),(int)name);
    val = 0;
    setintfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                (GCtab *)in_RDI,(char *)name,0);
    setintfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                (GCtab *)in_RDI,(char *)name,val);
    setintfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                (GCtab *)in_RDI,(char *)name,val);
    setintfield((lua_State *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                (GCtab *)in_RDI,(char *)name,val);
    pTVar1 = in_RDI->top;
    in_RDI->top = pTVar1 + 1;
    strlen(jit_trlinkname[name->linktype]);
    L_00 = (lua_State *)
           lj_str_new(in_stack_ffffffffffffffc8,
                      (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (size_t)in_RDI);
    (pTVar1->u32).lo = (uint32_t)L_00;
    (pTVar1->field_2).it = 0xfffffffb;
    lua_setfield(L_00,in_stack_ffffffffffffffc4,(char *)in_RDI);
  }
  return (uint)bVar2;
}

Assistant:

LJLIB_CF(jit_util_traceinfo)
{
  GCtrace *T = jit_checktrace(L);
  if (T) {
    GCtab *t;
    lua_createtable(L, 0, 8);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintfield(L, t, "nins", (int32_t)T->nins - REF_BIAS - 1);
    setintfield(L, t, "nk", REF_BIAS - (int32_t)T->nk);
    setintfield(L, t, "link", T->link);
    setintfield(L, t, "nexit", T->nsnap);
    setstrV(L, L->top++, lj_str_newz(L, jit_trlinkname[T->linktype]));
    lua_setfield(L, -2, "linktype");
    /* There are many more fields. Add them only when needed. */
    return 1;
  }
  return 0;
}